

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_enc.c
# Opt level: O3

void ClearHuffmanTreeIfOnlyOneSymbol(HuffmanTreeCode *huffman_code)

{
  int iVar1;
  bool bVar2;
  bool bVar3;
  long lVar4;
  
  iVar1 = huffman_code->num_symbols;
  if (0 < (long)iVar1) {
    lVar4 = 0;
    bVar2 = false;
    do {
      bVar3 = bVar2;
      if ((huffman_code->code_lengths[lVar4] != '\0') && (bVar3 = true, bVar2)) {
        return;
      }
      bVar2 = bVar3;
      lVar4 = lVar4 + 1;
    } while (iVar1 != lVar4);
    if (0 < iVar1) {
      lVar4 = 0;
      do {
        huffman_code->code_lengths[lVar4] = '\0';
        huffman_code->codes[lVar4] = 0;
        lVar4 = lVar4 + 1;
      } while (lVar4 < huffman_code->num_symbols);
    }
  }
  return;
}

Assistant:

static void ClearHuffmanTreeIfOnlyOneSymbol(
    HuffmanTreeCode* const huffman_code) {
  int k;
  int count = 0;
  for (k = 0; k < huffman_code->num_symbols; ++k) {
    if (huffman_code->code_lengths[k] != 0) {
      ++count;
      if (count > 1) return;
    }
  }
  for (k = 0; k < huffman_code->num_symbols; ++k) {
    huffman_code->code_lengths[k] = 0;
    huffman_code->codes[k] = 0;
  }
}